

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

BailOutInfo * __thiscall BasicBlock::CreateLoopTopBailOutInfo(BasicBlock *this,GlobOpt *globOpt)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  uint32 bailOutOffset;
  JitArenaAllocator *alloc;
  BailOutInfo *this_01;
  TrackAllocData local_50;
  BailOutInfo *local_28;
  BailOutInfo *bailOutInfo;
  Instr *firstInstr;
  GlobOpt *globOpt_local;
  BasicBlock *this_local;
  
  firstInstr = (Instr *)globOpt;
  globOpt_local = (GlobOpt *)this;
  bailOutInfo = (BailOutInfo *)GetFirstInstr(this);
  this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
            (firstInstr[1].m_src2)->_vptr_Opnd;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&BailOutInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
             ,0xcdb);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (this_00,&local_50);
  this_01 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,alloc,0x4e98c0);
  bailOutOffset = IR::Instr::GetByteCodeOffset((Instr *)bailOutInfo);
  BailOutInfo::BailOutInfo(this_01,bailOutOffset,(Func *)bailOutInfo->usedCapturedValues);
  this_01->isLoopTopBailOutInfo = true;
  local_28 = this_01;
  GlobOpt::FillBailOutInfo((GlobOpt *)firstInstr,this,this_01);
  local_28->bailOutOpcode = LoopBodyStart;
  return local_28;
}

Assistant:

BailOutInfo *
BasicBlock::CreateLoopTopBailOutInfo(GlobOpt * globOpt)
{
    IR::Instr * firstInstr = this->GetFirstInstr();
    BailOutInfo* bailOutInfo = JitAnew(globOpt->func->m_alloc, BailOutInfo, firstInstr->GetByteCodeOffset(), firstInstr->m_func);
    bailOutInfo->isLoopTopBailOutInfo = true;
    globOpt->FillBailOutInfo(this, bailOutInfo);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = Js::OpCode::LoopBodyStart;
#endif
    return bailOutInfo;
}